

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp_writer.c
# Opt level: O0

void DerefSentTimestep(SstStream Stream,WS_ReaderInfo Reader,ssize_t Timestep)

{
  size_t in_RDX;
  long in_RSI;
  SstStream in_RDI;
  _SentTimestepRec *ItemToFree;
  _SentTimestepRec *Next;
  int Freed;
  _SentTimestepRec *Last;
  _SentTimestepRec *List;
  size_t *Timestep_00;
  undefined4 in_stack_ffffffffffffffd0;
  int iVar1;
  size_t *local_28;
  size_t *local_20;
  
  Timestep_00 = *(size_t **)(in_RSI + 0x68);
  local_28 = (size_t *)0x0;
  CP_verbose(in_RDI,PerRankVerbose,"Reader sent timestep list %p, trying to release %zd\n",
             *(undefined8 *)(in_RSI + 0x68),in_RDX);
  while( true ) {
    local_20 = Timestep_00;
    if (local_20 == (size_t *)0x0) {
      return;
    }
    iVar1 = 0;
    Timestep_00 = (size_t *)local_20[1];
    CP_verbose(in_RDI,TraceVerbose,"Reader considering sent timestep %ld,trying to release %zd\n",
               *local_20,in_RDX);
    if (*local_20 == in_RDX) break;
    if (iVar1 == 0) {
      local_28 = local_20;
    }
  }
  SubRefTimestep((SstStream)CONCAT44(1,in_stack_ffffffffffffffd0),(ssize_t)Timestep_00,
                 (int)((ulong)local_20 >> 0x20));
  free(local_20);
  if (local_28 == (size_t *)0x0) {
    *(size_t **)(in_RSI + 0x68) = Timestep_00;
  }
  else {
    local_28[1] = (size_t)Timestep_00;
  }
  pthread_mutex_unlock((pthread_mutex_t *)&in_RDI->DataLock);
  if (in_RDI->DP_Interface->readerReleaseTimestep != (CP_DP_PerReaderReleaseTimestepFunc)0x0) {
    (*in_RDI->DP_Interface->readerReleaseTimestep)(&Svcs,*(DP_WSR_Stream *)(in_RSI + 0x70),in_RDX);
  }
  pthread_mutex_lock((pthread_mutex_t *)&in_RDI->DataLock);
  return;
}

Assistant:

static void DerefSentTimestep(SstStream Stream, WS_ReaderInfo Reader, ssize_t Timestep)
{
    struct _SentTimestepRec *List = Reader->SentTimestepList, *Last = NULL;
    CP_verbose(Stream, PerRankVerbose, "Reader sent timestep list %p, trying to release %zd\n",
               (void *)Reader->SentTimestepList, Timestep);

    while (List)
    {

        int Freed = 0;
        struct _SentTimestepRec *Next = List->Next;
        CP_verbose(Stream, TraceVerbose,
                   "Reader considering sent timestep %ld,trying to release %zd\n", List->Timestep,
                   Timestep);
        if (List->Timestep == Timestep)
        {
            struct _SentTimestepRec *ItemToFree = List;
            Freed = 1;
            SubRefTimestep(Stream, ItemToFree->Timestep, 1);
            free(ItemToFree);
            if (Last)
            {
                Last->Next = Next;
            }
            else
            {
                Reader->SentTimestepList = Next;
            }
            /* per reader release here */
            STREAM_MUTEX_UNLOCK(Stream);
            if (Stream->DP_Interface->readerReleaseTimestep)
            {
                (Stream->DP_Interface->readerReleaseTimestep)(&Svcs, Reader->DP_WSR_Stream,
                                                              Timestep);
            }
            STREAM_MUTEX_LOCK(Stream);
            return;
        }
        if (!Freed)
        {
            Last = List;
        }
        List = Next;
    }
}